

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugRnglists.cpp
# Opt level: O0

Error __thiscall
llvm::RangeListEntry::extract
          (RangeListEntry *this,DWARFDataExtractor Data,uint64_t End,uint64_t *OffsetPtr)

{
  byte bVar1;
  ulong uVar2;
  uint64_t uVar3;
  uint64_t *in_RCX;
  error_code EC;
  error_code EC_00;
  error_code EC_01;
  error_code EC_02;
  error_code EC_03;
  error_code EC_04;
  error_code EC_05;
  error_code EC_06;
  Error local_100;
  long local_f8;
  uint local_ec;
  error_code local_e8;
  error_code local_d8;
  long local_c8;
  uint64_t PreviousOffset_3;
  error_code local_b8;
  long local_a8;
  error_code local_a0;
  error_code local_90;
  long local_80;
  uint64_t PreviousOffset_2;
  error_category *local_70;
  long local_68;
  uint64_t PreviousOffset_1;
  error_code local_58;
  error_code local_48;
  long local_38;
  uint64_t PreviousOffset;
  uint64_t *puStack_28;
  uint8_t Encoding;
  uint64_t *OffsetPtr_local;
  uint64_t End_local;
  RangeListEntry *this_local;
  
  *(uint64_t *)End = *in_RCX;
  *(undefined8 *)(End + 0x10) = 0xffffffffffffffff;
  OffsetPtr_local = OffsetPtr;
  End_local = End;
  this_local = this;
  if (OffsetPtr <= (uint64_t *)*in_RCX) {
    __assert_fail("*OffsetPtr < End && \"not enough space to extract a rangelist encoding\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFDebugRnglists.cpp"
                  ,0x1a,
                  "Error llvm::RangeListEntry::extract(DWARFDataExtractor, uint64_t, uint64_t *)");
  }
  puStack_28 = in_RCX;
  PreviousOffset._7_1_ = DataExtractor::getU8(&Data.super_DataExtractor,in_RCX,(Error *)0x0);
  switch(PreviousOffset._7_1_) {
  case 0:
    *(undefined8 *)(End + 0x20) = 0;
    *(undefined8 *)(End + 0x18) = 0;
    break;
  case 1:
    local_38 = *puStack_28 - 1;
    uVar3 = DataExtractor::getULEB128(&Data.super_DataExtractor,puStack_28,(Error *)0x0);
    *(uint64_t *)(End + 0x18) = uVar3;
    if (OffsetPtr_local < (uint64_t *)*puStack_28) {
      std::error_code::error_code<llvm::errc,void>(&local_48,invalid_argument);
      EC._M_cat._0_4_ = local_48._M_value;
      EC._0_8_ = this;
      EC._M_cat._4_4_ = 0;
      createStringError<unsigned_long>
                (EC,(char *)local_48._M_cat,
                 (unsigned_long *)
                 "read past end of table when reading DW_RLE_base_addressx encoding at offset 0x%lx"
                );
      return (Error)(ErrorInfoBase *)this;
    }
    break;
  case 2:
    std::error_code::error_code<llvm::errc,void>(&local_58,not_supported);
    PreviousOffset_1 = *puStack_28 - 1;
    EC_00._M_cat._0_4_ = local_58._M_value;
    EC_00._0_8_ = this;
    EC_00._M_cat._4_4_ = 0;
    createStringError<unsigned_long>
              (EC_00,(char *)local_58._M_cat,
               (unsigned_long *)"unsupported rnglists encoding DW_RLE_startx_endx at offset 0x%lx");
    return (Error)(ErrorInfoBase *)this;
  case 3:
    local_68 = *puStack_28 - 1;
    uVar3 = DataExtractor::getULEB128(&Data.super_DataExtractor,puStack_28,(Error *)0x0);
    *(uint64_t *)(End + 0x18) = uVar3;
    uVar3 = DataExtractor::getULEB128(&Data.super_DataExtractor,puStack_28,(Error *)0x0);
    *(uint64_t *)(End + 0x20) = uVar3;
    if (OffsetPtr_local < (uint64_t *)*puStack_28) {
      std::error_code::error_code<llvm::errc,void>((error_code *)&PreviousOffset_2,invalid_argument)
      ;
      EC_01._M_cat._0_4_ = (undefined4)PreviousOffset_2;
      EC_01._0_8_ = this;
      EC_01._M_cat._4_4_ = 0;
      createStringError<unsigned_long>
                (EC_01,(char *)local_70,
                 (unsigned_long *)
                 "read past end of table when reading DW_RLE_startx_length encoding at offset 0x%lx"
                );
      return (Error)(ErrorInfoBase *)this;
    }
    break;
  case 4:
    local_80 = *puStack_28 - 1;
    uVar3 = DataExtractor::getULEB128(&Data.super_DataExtractor,puStack_28,(Error *)0x0);
    *(uint64_t *)(End + 0x18) = uVar3;
    uVar3 = DataExtractor::getULEB128(&Data.super_DataExtractor,puStack_28,(Error *)0x0);
    *(uint64_t *)(End + 0x20) = uVar3;
    if (OffsetPtr_local < (uint64_t *)*puStack_28) {
      std::error_code::error_code<llvm::errc,void>(&local_90,invalid_argument);
      EC_02._M_cat._0_4_ = local_90._M_value;
      EC_02._0_8_ = this;
      EC_02._M_cat._4_4_ = 0;
      createStringError<unsigned_long>
                (EC_02,(char *)local_90._M_cat,
                 (unsigned_long *)
                 "read past end of table when reading DW_RLE_offset_pair encoding at offset 0x%lx");
      return (Error)(ErrorInfoBase *)this;
    }
    break;
  case 5:
    uVar2 = (long)OffsetPtr_local - *puStack_28;
    bVar1 = DataExtractor::getAddressSize(&Data.super_DataExtractor);
    if (uVar2 < bVar1) {
      std::error_code::error_code<llvm::errc,void>(&local_a0,invalid_argument);
      local_a8 = *puStack_28 - 1;
      EC_03._M_cat._0_4_ = local_a0._M_value;
      EC_03._0_8_ = this;
      EC_03._M_cat._4_4_ = 0;
      createStringError<unsigned_long>
                (EC_03,(char *)local_a0._M_cat,
                 (unsigned_long *)
                 "insufficient space remaining in table for DW_RLE_base_address encoding at offset 0x%lx"
                );
      return (Error)(ErrorInfoBase *)this;
    }
    uVar3 = DWARFDataExtractor::getRelocatedAddress(&Data,puStack_28,(uint64_t *)(End + 0x10));
    *(uint64_t *)(End + 0x18) = uVar3;
    break;
  case 6:
    uVar2 = (long)OffsetPtr_local - *puStack_28;
    bVar1 = DataExtractor::getAddressSize(&Data.super_DataExtractor);
    if (uVar2 < (ulong)bVar1 << 1) {
      std::error_code::error_code<llvm::errc,void>(&local_b8,invalid_argument);
      PreviousOffset_3 = *puStack_28 - 1;
      EC_04._M_cat._0_4_ = local_b8._M_value;
      EC_04._0_8_ = this;
      EC_04._M_cat._4_4_ = 0;
      createStringError<unsigned_long>
                (EC_04,(char *)local_b8._M_cat,
                 (unsigned_long *)
                 "insufficient space remaining in table for DW_RLE_start_end encoding at offset 0x%lx"
                );
      return (Error)(ErrorInfoBase *)this;
    }
    uVar3 = DWARFDataExtractor::getRelocatedAddress(&Data,puStack_28,(uint64_t *)(End + 0x10));
    *(uint64_t *)(End + 0x18) = uVar3;
    uVar3 = DWARFDataExtractor::getRelocatedAddress(&Data,puStack_28,(uint64_t *)0x0);
    *(uint64_t *)(End + 0x20) = uVar3;
    break;
  case 7:
    local_c8 = *puStack_28 - 1;
    uVar3 = DWARFDataExtractor::getRelocatedAddress(&Data,puStack_28,(uint64_t *)(End + 0x10));
    *(uint64_t *)(End + 0x18) = uVar3;
    uVar3 = DataExtractor::getULEB128(&Data.super_DataExtractor,puStack_28,(Error *)0x0);
    *(uint64_t *)(End + 0x20) = uVar3;
    if (OffsetPtr_local < (uint64_t *)*puStack_28) {
      std::error_code::error_code<llvm::errc,void>(&local_d8,invalid_argument);
      EC_05._M_cat._0_4_ = local_d8._M_value;
      EC_05._0_8_ = this;
      EC_05._M_cat._4_4_ = 0;
      createStringError<unsigned_long>
                (EC_05,(char *)local_d8._M_cat,
                 (unsigned_long *)
                 "read past end of table when reading DW_RLE_start_length encoding at offset 0x%lx")
      ;
      return (Error)(ErrorInfoBase *)this;
    }
    break;
  default:
    std::error_code::error_code<llvm::errc,void>(&local_e8,not_supported);
    local_ec = (uint)PreviousOffset._7_1_;
    local_f8 = *puStack_28 - 1;
    EC_06._M_cat._0_4_ = local_e8._M_value;
    EC_06._0_8_ = this;
    EC_06._M_cat._4_4_ = 0;
    createStringError<unsigned_int,unsigned_long>
              (EC_06,(char *)local_e8._M_cat,
               (uint *)"unknown rnglists encoding 0x%x at offset 0x%lx",(unsigned_long *)&local_ec);
    return (Error)(ErrorInfoBase *)this;
  }
  *(byte *)(End + 8) = PreviousOffset._7_1_;
  Error::success();
  Error::Error((Error *)this,&local_100);
  ErrorSuccess::~ErrorSuccess((ErrorSuccess *)&local_100);
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error RangeListEntry::extract(DWARFDataExtractor Data, uint64_t End,
                              uint64_t *OffsetPtr) {
  Offset = *OffsetPtr;
  SectionIndex = -1ULL;
  // The caller should guarantee that we have at least 1 byte available, so
  // we just assert instead of revalidate.
  assert(*OffsetPtr < End &&
         "not enough space to extract a rangelist encoding");
  uint8_t Encoding = Data.getU8(OffsetPtr);

  switch (Encoding) {
  case dwarf::DW_RLE_end_of_list:
    Value0 = Value1 = 0;
    break;
  // TODO: Support other encodings.
  case dwarf::DW_RLE_base_addressx: {
    uint64_t PreviousOffset = *OffsetPtr - 1;
    Value0 = Data.getULEB128(OffsetPtr);
    if (End < *OffsetPtr)
      return createStringError(
          errc::invalid_argument,
          "read past end of table when reading "
          "DW_RLE_base_addressx encoding at offset 0x%" PRIx64,
          PreviousOffset);
    break;
  }
  case dwarf::DW_RLE_startx_endx:
    return createStringError(errc::not_supported,
                       "unsupported rnglists encoding DW_RLE_startx_endx at "
                       "offset 0x%" PRIx64,
                       *OffsetPtr - 1);
  case dwarf::DW_RLE_startx_length: {
    uint64_t PreviousOffset = *OffsetPtr - 1;
    Value0 = Data.getULEB128(OffsetPtr);
    Value1 = Data.getULEB128(OffsetPtr);
    if (End < *OffsetPtr)
      return createStringError(
          errc::invalid_argument,
          "read past end of table when reading "
          "DW_RLE_startx_length encoding at offset 0x%" PRIx64,
          PreviousOffset);
    break;
  }
  case dwarf::DW_RLE_offset_pair: {
    uint64_t PreviousOffset = *OffsetPtr - 1;
    Value0 = Data.getULEB128(OffsetPtr);
    Value1 = Data.getULEB128(OffsetPtr);
    if (End < *OffsetPtr)
      return createStringError(errc::invalid_argument,
                         "read past end of table when reading "
                         "DW_RLE_offset_pair encoding at offset 0x%" PRIx64,
                         PreviousOffset);
    break;
  }
  case dwarf::DW_RLE_base_address: {
    if ((End - *OffsetPtr) < Data.getAddressSize())
      return createStringError(errc::invalid_argument,
                         "insufficient space remaining in table for "
                         "DW_RLE_base_address encoding at offset 0x%" PRIx64,
                         *OffsetPtr - 1);
    Value0 = Data.getRelocatedAddress(OffsetPtr, &SectionIndex);
    break;
  }
  case dwarf::DW_RLE_start_end: {
    if ((End - *OffsetPtr) < unsigned(Data.getAddressSize() * 2))
      return createStringError(errc::invalid_argument,
                         "insufficient space remaining in table for "
                         "DW_RLE_start_end encoding "
                         "at offset 0x%" PRIx64,
                         *OffsetPtr - 1);
    Value0 = Data.getRelocatedAddress(OffsetPtr, &SectionIndex);
    Value1 = Data.getRelocatedAddress(OffsetPtr);
    break;
  }
  case dwarf::DW_RLE_start_length: {
    uint64_t PreviousOffset = *OffsetPtr - 1;
    Value0 = Data.getRelocatedAddress(OffsetPtr, &SectionIndex);
    Value1 = Data.getULEB128(OffsetPtr);
    if (End < *OffsetPtr)
      return createStringError(errc::invalid_argument,
                         "read past end of table when reading "
                         "DW_RLE_start_length encoding at offset 0x%" PRIx64,
                         PreviousOffset);
    break;
  }
  default:
    return createStringError(errc::not_supported,
                       "unknown rnglists encoding 0x%" PRIx32
                       " at offset 0x%" PRIx64,
                       uint32_t(Encoding), *OffsetPtr - 1);
  }

  EntryKind = Encoding;
  return Error::success();
}